

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O2

Am_Text_Fragment * __thiscall
Am_Rich_Text_Data::Get_Fragment_At
          (Am_Rich_Text_Data *this,Am_Text_Index inIndex,Am_Text_Length *outRelIndex)

{
  Am_Text_Fragment *pAVar1;
  Am_Text_Fragment **ppAVar2;
  ulong uVar3;
  ulong uVar4;
  
  ppAVar2 = &this->mHeadFragment;
  uVar3 = 0;
  while( true ) {
    pAVar1 = *ppAVar2;
    if (pAVar1 == (Am_Text_Fragment *)0x0) {
      return pAVar1;
    }
    uVar4 = pAVar1->mStrLen + uVar3;
    if (inIndex <= uVar4) break;
    ppAVar2 = &pAVar1->mNext;
    uVar3 = uVar4;
  }
  *outRelIndex = ~uVar3 + inIndex;
  return pAVar1;
}

Assistant:

Am_Text_Fragment *
Am_Rich_Text_Data::Get_Fragment_At(const Am_Text_Index inIndex,
                                   Am_Text_Length &outRelIndex) const
{
  Am_Text_Index endOfFrag = 0;
  Am_Text_Fragment *frag = mHeadFragment;

  while (frag != nullptr) {
    endOfFrag += frag->Length();
    if (inIndex <= endOfFrag) {
      // find the relative index
      outRelIndex = frag->Length() - endOfFrag + inIndex - 1;
      break;
    }
    frag = frag->Next();
  }
  return frag;
}